

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fixed_size_allocator.cpp
# Opt level: O1

IndexPointer __thiscall duckdb::FixedSizeAllocator::New(FixedSizeAllocator *this)

{
  BlockManager *block_manager;
  _Head_base<0UL,_duckdb::FixedSizeBuffer_*,_false> this_00;
  ulong uVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  uint32_t uVar3;
  _Head_base<0UL,_duckdb::FixedSizeBuffer_*,_false> this_02;
  mapped_type *pmVar4;
  __node_base_ptr p_Var5;
  pointer pFVar6;
  TemplatedValidityData<unsigned_long> *pTVar7;
  __node_base_ptr p_Var8;
  __hash_code __code;
  __node_base_ptr p_Var9;
  ulong uVar10;
  _Hash_node_base *this_03;
  idx_t buffer_id;
  idx_t buffer_id_1;
  _Head_base<0UL,_unsigned_long_*,_false> local_60;
  shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> local_58;
  ulong local_48;
  _Hash_node_base *local_40;
  element_type *local_38;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_30;
  ulong local_20;
  
  if ((this->buffer_with_free_space).index == 0xffffffffffffffff) {
    local_40 = (_Hash_node_base *)GetAvailableBufferId(this);
    block_manager = this->block_manager;
    this_02._M_head_impl = (FixedSizeBuffer *)operator_new(0x80);
    FixedSizeBuffer::FixedSizeBuffer(this_02._M_head_impl,block_manager);
    pmVar4 = ::std::__detail::
             _Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&this->buffers,(key_type *)&local_40);
    this_00._M_head_impl =
         (pmVar4->
         super_unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>_>).
         _M_t.
         super___uniq_ptr_impl<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::FixedSizeBuffer_*,_std::default_delete<duckdb::FixedSizeBuffer>_>
         .super__Head_base<0UL,_duckdb::FixedSizeBuffer_*,_false>._M_head_impl;
    (pmVar4->
    super_unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>_>)._M_t.
    super___uniq_ptr_impl<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::FixedSizeBuffer_*,_std::default_delete<duckdb::FixedSizeBuffer>_>
    .super__Head_base<0UL,_duckdb::FixedSizeBuffer_*,_false>._M_head_impl = this_02._M_head_impl;
    if (this_00._M_head_impl != (FixedSizeBuffer *)0x0) {
      FixedSizeBuffer::~FixedSizeBuffer(this_00._M_head_impl);
      operator_delete(this_00._M_head_impl);
    }
    local_60._M_head_impl = (unsigned_long *)&this->buffers_with_free_space;
    ::std::
    _Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
    ::
    _M_insert<unsigned_long_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_long,false>>>>
              ((_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                *)local_60._M_head_impl,&local_40);
    optional_idx::optional_idx((optional_idx *)&local_60,(idx_t)local_40);
    (this->buffer_with_free_space).index = (idx_t)local_60._M_head_impl;
    p_Var5 = (this->buffers)._M_h._M_buckets[(ulong)local_40 % (this->buffers)._M_h._M_bucket_count]
    ;
    for (p_Var9 = p_Var5->_M_nxt; local_40 != p_Var9[1]._M_nxt; p_Var9 = p_Var9->_M_nxt) {
      p_Var5 = p_Var9;
    }
    pFVar6 = unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
             ::operator->((unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
                           *)(p_Var5->_M_nxt + 2));
    local_60._M_head_impl = (unsigned_long *)FixedSizeBuffer::Get(pFVar6,true);
    uVar1 = this->available_segments_per_buffer;
    local_58.internal.
    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)0x0;
    local_58.internal.
    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_48 = uVar1;
    if (local_60._M_head_impl == (unsigned_long *)0x0) {
      local_20 = uVar1;
      make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                ((duckdb *)&local_38,&local_20);
      p_Var2 = p_Stack_30;
      local_58.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = local_38;
      this_01._M_pi =
           local_58.internal.
           super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
      local_38 = (element_type *)0x0;
      p_Stack_30 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_58.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = p_Var2;
      if (this_01._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01._M_pi);
      }
      if (p_Stack_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_30);
      }
      pTVar7 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->(&local_58)
      ;
      local_60._M_head_impl =
           (pTVar7->owned_data).
           super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
           super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
           super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
    }
    if (uVar1 != 0) {
      uVar10 = uVar1 + 0x3f >> 6;
      if (uVar10 != 1) {
        switchD_0105b559::default(local_60._M_head_impl,0xff,uVar10 * 8 - 8);
      }
      local_60._M_head_impl[uVar10 - 1] =
           local_60._M_head_impl[uVar10 - 1] |
           -(ulong)((uVar1 & 0x3f) == 0) | ~(-1L << ((byte)uVar1 & 0x3f));
    }
    if (local_58.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_58.internal.
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
  }
  local_60._M_head_impl = (unsigned_long *)optional_idx::GetIndex(&this->buffer_with_free_space);
  p_Var5 = (this->buffers)._M_h._M_buckets
           [(ulong)local_60._M_head_impl % (this->buffers)._M_h._M_bucket_count];
  p_Var9 = p_Var5->_M_nxt;
  while (p_Var8 = p_Var9, (_Hash_node_base *)local_60._M_head_impl != p_Var8[1]._M_nxt) {
    p_Var5 = p_Var8;
    p_Var9 = p_Var8->_M_nxt;
  }
  this_03 = p_Var5->_M_nxt + 2;
  pFVar6 = unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>::
           operator->((unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
                       *)this_03);
  uVar3 = FixedSizeBuffer::GetOffset(pFVar6,this->bitmask_count,this->available_segments_per_buffer)
  ;
  this->total_segment_count = this->total_segment_count + 1;
  pFVar6 = unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>::
           operator->((unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
                       *)this_03);
  pFVar6->segment_count = pFVar6->segment_count + 1;
  pFVar6 = unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>::
           operator->((unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
                       *)this_03);
  if (pFVar6->segment_count == this->available_segments_per_buffer) {
    ::std::
    _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::_M_erase(&(this->buffers_with_free_space)._M_h,&local_60);
    NextBufferWithFreeSpace(this);
  }
  return (IndexPointer)CONCAT44(uVar3,local_60._M_head_impl._0_4_);
}

Assistant:

IndexPointer FixedSizeAllocator::New() {
	// No more free segments available.
	if (!buffer_with_free_space.IsValid()) {
		// Add a new buffer.
		auto buffer_id = GetAvailableBufferId();
		buffers[buffer_id] = make_uniq<FixedSizeBuffer>(block_manager);
		buffers_with_free_space.insert(buffer_id);
		buffer_with_free_space = buffer_id;

		// Set and initialize the bitmask of the new buffer.
		D_ASSERT(buffers.find(buffer_id) != buffers.end());
		auto &buffer = buffers.find(buffer_id)->second;
		ValidityMask mask(reinterpret_cast<validity_t *>(buffer->Get()), available_segments_per_buffer);
		mask.SetAllValid(available_segments_per_buffer);
	}

	// Extract an index pointer to a free segment.

	D_ASSERT(buffer_with_free_space.IsValid());
	auto buffer_id = buffer_with_free_space.GetIndex();

	D_ASSERT(buffers.find(buffer_id) != buffers.end());
	auto &buffer = buffers.find(buffer_id)->second;
	auto offset = buffer->GetOffset(bitmask_count, available_segments_per_buffer);

	total_segment_count++;
	buffer->segment_count++;

	// If the buffer is full, we cache the next buffer that we're going to fill.
	if (buffer->segment_count == available_segments_per_buffer) {
		buffers_with_free_space.erase(buffer_id);
		NextBufferWithFreeSpace();
	}

	return IndexPointer(uint32_t(buffer_id), offset);
}